

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O1

void __thiscall test_adjacency_graph_at_Test::TestBody(test_adjacency_graph_at_Test *this)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  span<unsigned_long,_18446744073709551615UL> sVar8;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Adjacency_Graph<true> graph;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  AssertHelper local_d8;
  undefined1 local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  Adjacency_Graph<false> local_90 [48];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  local_d0 = (undefined1  [8])0x0;
  local_c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_c0._0_1_ = true;
  local_c0._1_7_ = 0;
  local_b8 = 1;
  local_b0 = 2;
  local_a8 = 3;
  local_a0 = 3;
  local_98 = 0;
  edge_graph._M_len = 4;
  edge_graph._M_array = (iterator)local_d0;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_90,edge_graph);
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[0][0]","1",sVar8._M_ptr,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[0][1]","3",sVar8._M_ptr + 1,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[1][0]","0",sVar8._M_ptr,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[1][1]","2",sVar8._M_ptr + 1,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[2][0]","1",sVar8._M_ptr,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[2][1]","3",sVar8._M_ptr + 1,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[3][0]","0",sVar8._M_ptr,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x60,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  sVar8 = Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)&local_e0);
  local_d8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_d0,"graph[3][1]","2",sVar8._M_ptr + 1,(int *)&local_d8);
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(local_c8._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x61,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi
                );
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1592e8;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_d0,
               (testing *)&local_e0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_48,(PolymorphicMatcher *)local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("auto test_0 = graph[-1]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,99,(DeathTest **)&local_d8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    bVar3 = true;
    if (bVar4) {
      plVar1 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
      if (plVar1 != (long *)0x0) {
        iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1);
        if (iVar6 == 0) {
          plVar2 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
          iVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar6);
          cVar5 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
          if (cVar5 != '\0') goto LAB_0010f911;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            plVar2 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              local_d0 = (undefined1  [8])0xffffffffffffffff;
              Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)local_d0);
            }
            (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x28))
                      ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_),2);
            (**(code **)(*plVar2 + 0x28))(plVar2,0);
          }
LAB_0010f911:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*plVar1 + 8))(plVar1);
        if (!bVar4) goto LAB_0010f924;
      }
      bVar3 = false;
    }
LAB_0010f924:
    if (bVar3) goto LAB_0010f928;
  }
  else {
LAB_0010f928:
    testing::Message::Message((Message *)local_d0);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,99,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1592e8;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_d0,
               (testing *)&local_e0,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_60,(PolymorphicMatcher *)local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("auto test_1 = graph[4]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,100,(DeathTest **)&local_d8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    bVar3 = true;
    if (bVar4) {
      plVar1 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
      if (plVar1 != (long *)0x0) {
        iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1);
        if (iVar6 == 0) {
          plVar2 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
          iVar6 = (**(code **)(*plVar2 + 0x18))(plVar2);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar6);
          cVar5 = (**(code **)(*plVar2 + 0x20))(plVar2,bVar3);
          if (cVar5 != '\0') goto LAB_0010fa90;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            plVar2 = (long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              local_d0 = (undefined1  [8])&DAT_00000004;
              Disa::Adjacency_Graph<false>::operator[](local_90,(size_t *)local_d0);
            }
            (**(code **)(*(long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x28))
                      ((long *)CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_),2);
            (**(code **)(*plVar2 + 0x28))(plVar2,0);
          }
LAB_0010fa90:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*plVar1 + 8))(plVar1);
        if (!bVar4) goto LAB_0010faa3;
      }
      bVar3 = false;
    }
LAB_0010faa3:
    if (!bVar3) goto LAB_0010fafd;
  }
  testing::Message::Message((Message *)local_d0);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
             ,100,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_d0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_d0 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    (**(code **)(*(long *)local_d0 + 8))();
  }
LAB_0010fafd:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_90);
  return;
}

Assistant:

TEST(test_adjacency_graph, at) {
  Adjacency_Graph<false> graph({{0, 1}, {2, 1}, {2, 3}, {3, 0}});  // place some edge backwards.

  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 3);
  EXPECT_EQ(graph[1][0], 0);
  EXPECT_EQ(graph[1][1], 2);
  EXPECT_EQ(graph[2][0], 1);
  EXPECT_EQ(graph[2][1], 3);
  EXPECT_EQ(graph[3][0], 0);
  EXPECT_EQ(graph[3][1], 2);

  EXPECT_DEATH(auto test_0 = graph[-1], "./*");
  EXPECT_DEATH(auto test_1 = graph[4], "./*");
}